

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

void __thiscall cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig(LaunchHelper *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string srcdir;
  string fname;
  cmGeneratedFileStream fout;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  undefined8 local_260;
  char *local_258;
  undefined8 local_250;
  
  WriteScrapeMatchers(this,"Warning",&this->Handler->ReallyCustomWarningMatches);
  WriteScrapeMatchers(this,"WarningSuppress",&this->Handler->ReallyCustomWarningExceptions);
  local_278._8_8_ = (this->Handler->CTestLaunchDir)._M_dataplus._M_p;
  local_278._0_8_ = (this->Handler->CTestLaunchDir)._M_string_length;
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_260 = 0x18;
  local_258 = "/CTestLaunchConfig.cmake";
  local_250 = 0;
  views._M_len = 2;
  views._M_array = (iterator)local_278;
  cmCatViews(&local_298,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,&local_298,false,None);
  this_00 = this->CTest;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"SourceDirectory","");
  cmCTest::GetCTestConfiguration(&local_2b8,this_00,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"set(CTEST_SOURCE_DIRECTORY \"",0x1c);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_278,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig()
{
  this->WriteScrapeMatchers("Warning",
                            this->Handler->ReallyCustomWarningMatches);
  this->WriteScrapeMatchers("WarningSuppress",
                            this->Handler->ReallyCustomWarningExceptions);

  // Give some testing configuration information to the launcher.
  std::string fname =
    cmStrCat(this->Handler->CTestLaunchDir, "/CTestLaunchConfig.cmake");
  cmGeneratedFileStream fout(fname);
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  fout << "set(CTEST_SOURCE_DIRECTORY \"" << srcdir << "\")\n";
}